

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Connection_testWeight_Test::TestBody(Connection_testWeight_Test *this)

{
  bool bVar1;
  char *pcVar2;
  float fVar3;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  Connection local_40;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  int local_14;
  
  local_48.data_._0_4_ = 9;
  Connection::Connection(&local_40,(Neuron *)0x0,10.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"9","int(Connection(0, 10).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0x27;
  Connection::Connection(&local_40,(Neuron *)0x0,50.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"39","int(Connection(0, 50).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x12,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0xffffffd9;
  Connection::Connection(&local_40,(Neuron *)0x0,-50.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"-39","int(Connection(0, -50).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x13,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0x3f;
  Connection::Connection(&local_40,(Neuron *)0x0,100.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"63","int(Connection(0, 100).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x14,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0xffffffc1;
  Connection::Connection(&local_40,(Neuron *)0x0,-100.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"-63","int(Connection(0, -100).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 100;
  Connection::Connection(&local_40,(Neuron *)0x0,10000.0,100.0,100.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"100","int(Connection(0, 10000).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 99;
  Connection::Connection(&local_40,(Neuron *)0x0,100.0,100.0,10.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"99","int(Connection(0, 100, 100, 10).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x17,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0x56;
  Connection::Connection(&local_40,(Neuron *)0x0,100.0,100.0,50.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"86","int(Connection(0, 100, 100, 50).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0x51;
  Connection::Connection(&local_40,(Neuron *)0x0,100.0,100.0,60.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"81","int(Connection(0, 100, 100, 60).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x19,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.data_._0_4_ = 0x43;
  Connection::Connection(&local_40,(Neuron *)0x0,100.0,100.0,90.0);
  fVar3 = Connection::weight(&local_40);
  local_14 = (int)fVar3;
  testing::internal::CmpHelperEQ<int,int>
            (local_28,"67","int(Connection(0, 100, 100, 90).weight())",(int *)&local_48,&local_14);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x1a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if (local_40.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_40.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_40.m_target + 8))();
      }
      local_40.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Connection, testWeight)
{
    EXPECT_EQ(9, int(Connection(0, 10).weight()));
    EXPECT_EQ(39, int(Connection(0, 50).weight()));
    EXPECT_EQ(-39, int(Connection(0, -50).weight()));
    EXPECT_EQ(63, int(Connection(0, 100).weight()));
    EXPECT_EQ(-63, int(Connection(0, -100).weight()));
    EXPECT_EQ(100, int(Connection(0, 10000).weight()));
    EXPECT_EQ(99, int(Connection(0, 100, 100, 10).weight()));
    EXPECT_EQ(86, int(Connection(0, 100, 100, 50).weight()));
    EXPECT_EQ(81, int(Connection(0, 100, 100, 60).weight()));
    EXPECT_EQ(67, int(Connection(0, 100, 100, 90).weight()));
}